

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLLinOp::remapNeighborhoods
          (MLLinOp *this,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *dms)

{
  return;
}

Assistant:

void
MLLinOp::remapNeighborhoods (Vector<DistributionMapping> & dms)
{
#ifdef AMREX_USE_MPI
    BL_PROFILE("MLLinOp::remapNeighborhoods()");

    if (flag_verbose_linop) {
        Print() << "Remapping ranks to neighborhoods ..." << std::endl;
    }

    for (int j = 1; j < dms.size(); ++j)
    {
        const Vector<int> & pmap = dms[j].ProcessorMap();
        std::set<int> g_ranks_set(pmap.begin(), pmap.end());
        int lev_rank_n = g_ranks_set.size();
        if (lev_rank_n >= remap_nbh_lb && lev_rank_n < ParallelContext::NProcsSub())
        {
            // find best neighborhood with lev_rank_n ranks
            auto nbh_g_ranks = machine::find_best_nbh(lev_rank_n);
            AMREX_ASSERT(nbh_g_ranks.size() == lev_rank_n);

            // construct mapping from original global rank to neighborhood global rank
            int idx = 0;
            std::unordered_map<int, int> rank_mapping;
            for (auto orig_g_rank : g_ranks_set) {
                AMREX_ASSERT(idx < nbh_g_ranks.size());
                rank_mapping[orig_g_rank] = nbh_g_ranks[idx++];
            }

            // remap and create new DM
            Vector<int> nbh_pmap(pmap.size());
            for (int i = 0; i < pmap.size(); ++i) {
                nbh_pmap[i] = rank_mapping.at(pmap[i]);
            }
            dms[j] = DistributionMapping(std::move(nbh_pmap));
        }
    }
#else
    amrex::ignore_unused(dms);
#endif
}